

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  void *pvVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  u32 uVar6;
  BtShared *pBVar7;
  PgHdr *pPVar8;
  uint *pCell;
  undefined4 uVar9;
  undefined8 uVar10;
  i64 iVar11;
  ushort uVar12;
  u16 uVar13;
  u16 uVar14;
  Pgno PVar15;
  int iVar16;
  Pgno PVar17;
  undefined1 *puVar18;
  ulong uVar19;
  MemPage **ppMVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  u8 uVar25;
  int iVar26;
  ulong uVar27;
  MemPage *pMVar28;
  uint uVar29;
  MemPage *pMVar30;
  uint uVar31;
  int iVar32;
  u16 *puVar33;
  u8 *puVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  u8 *puVar38;
  ulong uVar39;
  ulong uVar40;
  uint *puVar41;
  undefined4 *puVar42;
  MemPage *pMVar43;
  long in_FS_OFFSET;
  bool bVar44;
  int rc_1;
  int rc;
  int cntNew [5];
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  Pgno pgnoNew;
  Pgno aPgOrder [5];
  int cntOld [5];
  u16 aPgFlags [5];
  Pgno aPgno [5];
  u8 *apDiv [2];
  u8 aBalanceQuickSpace [13];
  Pgno local_264;
  MemPage *local_260;
  MemPage *local_258;
  u16 *local_250;
  ulong local_248;
  BtCursor *local_240;
  ulong local_238;
  ulong local_230;
  MemPage *local_228;
  undefined1 *local_220;
  uint local_214;
  ulong local_210;
  ulong local_208;
  BtShared *local_200;
  ulong local_1f8;
  MemPage *local_1f0;
  undefined1 local_1e8 [32];
  undefined8 local_1c8;
  undefined8 local_1b0;
  uint local_1a8 [7];
  uint local_18c [7];
  u16 *local_170;
  undefined4 local_168;
  undefined1 local_164;
  ulong local_160;
  void *local_158;
  uint local_150;
  uint local_14c;
  MemPage *local_148;
  void *local_140;
  MemPage *local_138 [5];
  ulong local_110;
  ulong local_108;
  CellInfo local_100;
  Pgno PStack_e8;
  uint local_e4 [7];
  uint auStack_c8 [6];
  ulong local_b0;
  long local_a8;
  long local_a0;
  uint *local_98;
  ulong local_90;
  u16 auStack_82 [5];
  Pgno aPStack_78 [6];
  undefined1 local_60 [8];
  undefined8 auStack_58 [2];
  u8 local_45 [4];
  u8 auStack_41 [9];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  local_140 = (void *)0x0;
  local_240 = pCur;
LAB_00141688:
  lVar37 = (long)pCur->iPage;
  pMVar28 = pCur->apPage[lVar37];
  if (lVar37 != 0) {
    if (pMVar28->nOverflow == '\0') {
      bVar44 = false;
      if (pMVar28->nFree <= (uint)local_90) {
        PVar15 = 0;
        goto LAB_00141ada;
      }
    }
    pMVar30 = pCur->apPage[lVar37 + -1];
    uVar12 = pCur->aiIdx[lVar37 + -1];
    PVar15 = sqlite3PagerWrite(pMVar30->pDbPage);
    if (PVar15 == 0) {
      local_1f0 = pMVar30;
      if ((((pMVar28->intKeyLeaf != '\0') && (pMVar28->nOverflow == '\x01')) &&
          (pMVar28->aiOvfl[0] == pMVar28->nCell)) &&
         ((pMVar30->pgno != 1 && (pMVar30->nCell == uVar12)))) {
        if (pMVar28->nCell == 0) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
          PVar15 = 0xb;
        }
        else {
          pBVar7 = pMVar28->pBt;
          local_1c8._0_4_ = allocateBtreePage(pBVar7,local_138,(Pgno *)&local_100,0,'\0');
          PVar15 = (Pgno)local_1c8;
          if ((Pgno)local_1c8 == 0) {
            puVar34 = pMVar28->apOvfl[0];
            local_258 = pMVar28;
            local_1e8._0_8_ = puVar34;
            uVar14 = (*pMVar28->xCellSize)(pMVar28,puVar34);
            pMVar30 = local_138[0];
            local_1a8[0] = CONCAT22(local_1a8[0]._2_2_,uVar14);
            zeroPage(local_138[0],0xd);
            local_1c8._0_4_ = rebuildPage(pMVar30,1,(u8 **)local_1e8,(u16 *)local_1a8);
            pMVar28 = local_258;
            PVar15 = (Pgno)local_1c8;
            if ((Pgno)local_1c8 == 0) {
              pMVar30->nFree = ((short)pBVar7->usableSize - (pMVar30->cellOffset + uVar14)) - 2;
              if (pBVar7->autoVacuum != '\0') {
                ptrmapPut(pBVar7,(Pgno)local_100.nKey,'\x05',local_1f0->pgno,(int *)&local_1c8);
                if (pMVar30->minLocal < uVar14) {
                  ptrmapPutOvflPtr(pMVar30,puVar34,(int *)&local_1c8);
                }
              }
              pMVar43 = local_1f0;
              pMVar28 = local_258;
              uVar24 = 0;
              local_1e8._0_8_ =
                   local_258->aData +
                   (CONCAT11(local_258->aCellIdx[(ulong)local_258->nCell * 2 + -2],
                             local_258->aCellIdx[(ulong)local_258->nCell * 2 + -1]) &
                   local_258->maskPage);
              do {
                puVar34 = (u8 *)local_1e8._0_8_;
                local_1e8._0_8_ = puVar34 + 1;
                if (7 < uVar24) break;
                uVar24 = uVar24 + 1;
              } while ((char)*puVar34 < '\0');
              lVar37 = 4;
              do {
                uVar25 = *(u8 *)local_1e8._0_8_;
                local_1e8._0_8_ = local_1e8._0_8_ + 1;
                local_45[lVar37] = uVar25;
                lVar37 = lVar37 + 1;
                if (-1 < (char)uVar25) break;
              } while ((ulong)local_1e8._0_8_ < puVar34 + 10);
              if ((Pgno)local_1c8 == 0) {
                insertCell(local_1f0,(uint)local_1f0->nCell,local_45,(int)lVar37,(u8 *)0x0,
                           local_258->pgno,(int *)&local_1c8);
              }
              *(Pgno *)(pMVar43->aData + (ulong)pMVar43->hdrOffset + 8) =
                   (Pgno)local_100.nKey >> 0x18 | ((Pgno)local_100.nKey & 0xff0000) >> 8 |
                   ((Pgno)local_100.nKey & 0xff00) << 8 | (Pgno)local_100.nKey << 0x18;
              PVar15 = (Pgno)local_1c8;
              if (pMVar30 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar30->pDbPage);
                PVar15 = (Pgno)local_1c8;
              }
            }
          }
        }
        goto LAB_00141abf;
      }
      local_158 = pcache1Alloc(pCur->pBt->pageSize);
      local_264 = 0;
      local_168 = 0;
      local_164 = 0;
      local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
      local_1e8._16_8_ = (MemPage *)0x0;
      if (local_158 != (void *)0x0) {
        uVar31 = pCur->hints & 1;
        local_108 = (ulong)uVar31;
        uVar36 = (uint)pMVar30->nCell + (uint)pMVar30->nOverflow;
        local_160 = 0;
        if (1 < uVar36) {
          uVar29 = (uint)uVar12;
          if (uVar29 == 0) {
            local_160 = 0;
          }
          else if (uVar36 == uVar29) {
            local_160 = (ulong)((uVar36 + uVar31) - 2);
          }
          else {
            local_160 = (ulong)(uVar29 - 1);
          }
          uVar36 = 2 - uVar31;
        }
        uVar24 = (ulong)uVar36;
        uVar31 = ((int)local_160 - (uint)pMVar30->nOverflow) + uVar36;
        if (uVar31 == pMVar30->nCell) {
          uVar27 = (ulong)pMVar30->hdrOffset + 8;
        }
        else {
          uVar27 = (ulong)(CONCAT11(pMVar30->aCellIdx[(long)(int)uVar31 * 2],
                                    pMVar30->aCellIdx[(long)(int)uVar31 * 2 + 1]) &
                          pMVar30->maskPage);
        }
        local_98 = (uint *)(pMVar30->aData + uVar27);
        local_200 = pMVar30->pBt;
        uVar27 = (ulong)(uVar36 + 1);
        uVar31 = *local_98;
        local_214 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                    uVar31 << 0x18;
        local_248 = CONCAT44(local_248._4_4_,local_214);
        local_a0 = lVar37;
        local_264 = getAndInitPage(local_200,local_214,(MemPage **)(&local_1c8 + uVar24),
                                   (BtCursor *)0x0,0);
        local_238 = uVar27;
        if (local_264 == 0) {
          local_14c = uVar36 + 1;
          pMVar43 = (MemPage *)(&local_1c8)[uVar24];
          iVar26 = (uint)pMVar43->nCell + (uint)pMVar43->nOverflow + 1;
          local_258 = pMVar28;
          local_1f8 = uVar24;
          local_110 = uVar24;
          if (uVar36 != 0) {
            pMVar43 = (MemPage *)(ulong)(((int)local_160 + uVar36) - 1);
            iVar35 = ((int)local_160 + uVar36) * 2;
            local_250 = (u16 *)(local_18c + uVar24);
            local_260 = (MemPage *)(ulong)(uVar36 * 8);
            local_220 = local_60 + (long)local_260;
            local_228 = (MemPage *)((long)local_260->aiOvfl + (long)(local_1e8 + -2));
            local_230 = -uVar24;
            lVar37 = 0;
            uVar24 = 0;
            local_148 = pMVar43;
            do {
              iVar35 = iVar35 + -2;
              iVar16 = (int)uVar24;
              if ((pMVar30->nOverflow == 0) || ((int)pMVar43 + iVar16 != (uint)pMVar30->aiOvfl[0]))
              {
                puVar38 = pMVar30->aData;
                lVar22 = (long)(int)(iVar35 + (uint)pMVar30->nOverflow * -2);
                uVar12 = CONCAT11(pMVar30->aCellIdx[lVar22],pMVar30->aCellIdx[lVar22 + 1]) &
                         pMVar30->maskPage;
                puVar34 = puVar38 + uVar12;
                *(u8 **)(local_220 + uVar24 * 8) = puVar34;
                uVar31 = *(uint *)(puVar38 + uVar12);
                local_248 = CONCAT44(local_248._4_4_,
                                     uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                     (uVar31 & 0xff00) << 8 | uVar31 << 0x18);
                uVar14 = (*pMVar30->xCellSize)(pMVar30,puVar34);
                uVar31 = (uint)uVar14;
                *(uint *)(local_250 + uVar24 * 2) = (uint)uVar14;
                if ((local_200->btsFlags & 0xc) != 0) {
                  iVar21 = (int)puVar34 - *(int *)&pMVar30->aData;
                  iVar32 = iVar21 + (uint)uVar14;
                  local_1b0 = CONCAT44(local_1b0._4_4_,iVar32);
                  local_210 = CONCAT44(local_210._4_4_,local_200->usableSize);
                  local_208 = (ulong)uVar14;
                  if ((int)local_200->usableSize < iVar32) {
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
                    local_264 = 0xb;
                    memset(&local_1c8,0,(long)local_260->aiOvfl + lVar37 + -0x1a);
                  }
                  else {
                    memcpy((void *)((long)iVar21 + (long)local_158),puVar34,(ulong)(uint)uVar14);
                    *(long *)(local_220 + uVar24 * 8) =
                         ((long)puVar34 - (long)pMVar30->aData) + (long)local_158;
                  }
                  uVar31 = (uint)local_208;
                  pMVar30 = local_1f0;
                  if ((int)local_210 < (int)local_1b0) {
                    local_214 = (Pgno)local_248;
                    goto LAB_00142482;
                  }
                }
                pMVar43 = local_148;
                dropCell(pMVar30,((int)local_148 + iVar16) - (uint)pMVar30->nOverflow,uVar31,
                         (int *)&local_264);
              }
              else {
                puVar41 = (uint *)pMVar30->apOvfl[0];
                *(uint **)(local_220 + uVar24 * 8) = puVar41;
                uVar31 = *puVar41;
                local_248 = CONCAT44(local_248._4_4_,
                                     uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                     (uVar31 & 0xff00) << 8 | uVar31 << 0x18);
                uVar14 = (*pMVar30->xCellSize)(pMVar30,(u8 *)puVar41);
                *(uint *)(local_250 + uVar24 * 2) = (uint)uVar14;
                pMVar30->nOverflow = '\0';
              }
              pMVar28 = local_228;
              local_264 = getAndInitPage(local_200,(Pgno)local_248,
                                         (MemPage **)((long)local_228->aiOvfl + lVar37 + -0x1a),
                                         (BtCursor *)0x0,0);
              if (local_264 != 0) {
                uVar36 = (iVar16 + (int)local_1f8) - 1;
                pMVar28 = local_258;
                goto LAB_00141a0d;
              }
              iVar26 = iVar26 + (uint)*(ushort *)
                                       (*(long *)(pMVar28->aiOvfl + uVar24 * 4 + -0xd) + 0x16) +
                       (uint)*(byte *)(*(long *)(pMVar28->aiOvfl + uVar24 * 4 + -0xd) + 0xc) + 1;
              uVar24 = uVar24 - 1;
              lVar37 = lVar37 + -8;
              pMVar30 = local_1f0;
            } while (local_230 != uVar24);
          }
          local_214 = (Pgno)local_248;
          uVar31 = iVar26 + 3U & 0xfffffffc;
          local_1e8._16_8_ = sqlite3ScratchMalloc(uVar31 * 10 + local_200->pageSize);
          if ((MemPage *)local_1e8._16_8_ == (MemPage *)0x0) {
            local_264 = 7;
LAB_00142482:
            local_260 = (MemPage *)0x0;
            uVar24 = local_238;
            pMVar28 = local_258;
            pCur = local_240;
            PVar17 = local_264;
            pMVar30 = local_260;
          }
          else {
            local_a8 = (long)(int)uVar31;
            local_250 = ((MemPage *)local_1e8._16_8_)->aiOvfl + local_a8 * 4 + -0xd;
            local_1e8._24_8_ = local_250;
            local_260 = (MemPage *)(local_250 + local_a8);
            local_1e8._8_8_ = CONCAT44(local_1c8._4_4_,(Pgno)local_1c8);
            local_150 = (uint)((MemPage *)local_1e8._8_8_)->leaf;
            local_210 = (ulong)((MemPage *)local_1e8._8_8_)->leaf << 2;
            local_148 = (MemPage *)local_1e8._8_8_;
            local_220 = (undefined1 *)(ulong)((MemPage *)local_1e8._8_8_)->intKeyLeaf;
            local_170 = ((MemPage *)local_1e8._16_8_)->aiOvfl + local_a8 * 5 + -0xd;
            uVar27 = 0;
            iVar26 = 0;
            uVar31 = 0;
            local_228 = (MemPage *)local_1e8._16_8_;
            do {
              lVar37 = (&local_1c8)[uVar27];
              puVar34 = *(u8 **)(lVar37 + 0x50);
              uVar25 = *puVar34;
              local_248 = CONCAT71(local_248._1_7_,*local_148->aData);
              if (uVar25 == *local_148->aData) {
                local_208 = CONCAT71(local_208._1_7_,uVar25);
                uVar12 = *(ushort *)(lVar37 + 0x18);
                puVar38 = puVar34 + *(ushort *)(lVar37 + 0x12);
                local_1b0 = (ulong)(int)uVar31;
                local_230 = uVar27;
                memset(local_250 + local_1b0,0,
                       (ulong)(((uint)*(byte *)(lVar37 + 0xc) + (uint)*(ushort *)(lVar37 + 0x16)) *
                              2));
                puVar33 = local_250;
                bVar3 = *(byte *)(lVar37 + 0xc);
                if (bVar3 != 0) {
                  uVar4 = *(ushort *)(lVar37 + 0x1a);
                  if (uVar4 != 0) {
                    lVar22 = 0;
                    do {
                      *(u8 **)(local_228->aiOvfl + local_1b0 * 4 + lVar22 * 4 + -0xd) =
                           puVar34 + (uVar12 & CONCAT11(*puVar38,puVar38[1]));
                      puVar38 = puVar38 + 2;
                      lVar22 = lVar22 + 1;
                    } while ((uint)uVar4 != (uint)lVar22);
                    uVar31 = uVar31 + (uint)lVar22;
                  }
                  uVar36 = (uint)bVar3;
                  if (bVar3 < 2) {
                    uVar36 = 1;
                  }
                  uVar24 = 0;
                  do {
                    *(undefined8 *)(local_228->aiOvfl + (long)(int)uVar31 * 4 + uVar24 * 4 + -0xd) =
                         *(undefined8 *)(lVar37 + 0x28 + uVar24 * 8);
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                  uVar31 = uVar31 + (int)uVar24;
                  local_1e8._0_8_ = CONCAT44(SUB84(local_1e8._0_8_,4),uVar31);
                }
                uVar4 = *(ushort *)(lVar37 + 0x12);
                uVar5 = *(ushort *)(lVar37 + 0x16);
                if (puVar38 < puVar34 + (ulong)uVar5 * 2 + (ulong)uVar4) {
                  lVar22 = (long)(int)uVar31;
                  lVar23 = 0;
                  do {
                    puVar1 = puVar38 + lVar23;
                    *(u8 **)(local_228->aiOvfl + lVar22 * 4 + lVar23 * 2 + -0xd) =
                         puVar34 + (CONCAT11(*puVar1,puVar1[1]) & uVar12);
                    uVar31 = uVar31 + 1;
                    local_1e8._0_4_ = uVar31;
                    lVar23 = lVar23 + 2;
                  } while (puVar1 + 2 < puVar34 + (ulong)uVar5 * 2 + (ulong)uVar4);
                }
                auStack_c8[local_230] = uVar31;
                if ((local_1f8 <= local_230) || ((char)local_220 != '\0')) {
                  uVar27 = local_230;
                  uVar25 = (u8)local_208;
                  goto LAB_00142078;
                }
                uVar36 = local_18c[local_230 + 1] & 0xffff;
                lVar22 = (long)(int)uVar31;
                local_250[lVar22] = (u16)local_18c[local_230 + 1];
                pvVar2 = (void *)((long)local_260 + (long)iVar26);
                iVar26 = iVar26 + uVar36;
                memcpy(pvVar2,(void *)auStack_58[local_230],(ulong)uVar36);
                puVar42 = (undefined4 *)((long)pvVar2 + local_210);
                *(undefined4 **)(local_228->aiOvfl + lVar22 * 4 + -0xd) = puVar42;
                uVar12 = puVar33[lVar22] - (short)local_210;
                puVar33[lVar22] = uVar12;
                if (*(char *)(lVar37 + 8) == '\0') {
                  *puVar42 = *(undefined4 *)(*(long *)(lVar37 + 0x50) + 8);
                }
                else if (uVar12 < 4) {
                  puVar18 = (undefined1 *)((long)iVar26 + (long)local_170);
                  do {
                    *puVar18 = 0;
                    uVar14 = puVar33[lVar22];
                    puVar33[lVar22] = uVar14 + 1;
                    puVar18 = puVar18 + 1;
                    iVar26 = iVar26 + 1;
                  } while ((ushort)(uVar14 + 1) < 4);
                }
                uVar31 = uVar31 + 1;
                local_1e8._0_4_ = uVar31;
                uVar27 = local_230;
                uVar25 = (u8)local_208;
              }
              else {
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
                local_264 = 0xb;
LAB_00142078:
              }
              uVar24 = local_238;
              if (uVar25 != (u8)local_248) {
                local_260 = (MemPage *)0x0;
                pMVar28 = local_258;
                pCur = local_240;
                PVar17 = local_264;
                pMVar30 = local_260;
                goto LAB_00141a3d;
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_238);
            local_260 = (MemPage *)0x0;
            local_b0 = local_210 & 0xffff;
            local_248 = CONCAT44(local_248._4_4_,
                                 local_200->usableSize + (uint)(ushort)local_210 + -0xc);
            uVar27 = 0;
            do {
              lVar37 = (&local_1c8)[uVar27];
              local_18c[uVar27 + 1] = (Pgno)local_248 - *(ushort *)(lVar37 + 0x14);
              if (*(char *)(lVar37 + 0xc) != '\0') {
                uVar39 = 0;
                do {
                  uVar12 = (**(code **)(lVar37 + 0x78))
                                     (lVar37,*(undefined8 *)(lVar37 + 0x28 + uVar39 * 8));
                  local_18c[uVar27 + 1] = (uint)uVar12 + local_18c[uVar27 + 1] + 2;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < *(byte *)(lVar37 + 0xc));
              }
              local_1a8[uVar27] = auStack_c8[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar24);
            local_170 = (u16 *)CONCAT44(local_170._4_4_,local_264);
            local_230 = CONCAT44(local_230._4_4_,local_1e8._0_4_);
            local_208 = (ulong)(int)local_1e8._0_4_;
            local_1b0 = -local_208;
            uVar39 = 0;
            uVar27 = (ulong)local_14c;
            puVar33 = local_250;
            do {
              uVar31 = local_18c[uVar39 + 1];
              if ((int)(Pgno)local_248 < (int)uVar31) {
                local_210 = CONCAT44(local_210._4_4_,(int)uVar39 + 2);
                do {
                  if ((long)(int)uVar27 <= (long)(uVar39 + 1)) {
                    if (3 < uVar39) {
                      local_18c[uVar39 + 1] = uVar31;
                      bVar44 = false;
                      local_170 = (u16 *)CONCAT44(local_170._4_4_,0xb);
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1059f,
                                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34"
                                 );
                      puVar33 = local_250;
                      uVar27 = local_210 & 0xffffffff;
                      pCur = local_240;
                      goto LAB_0014238c;
                    }
                    local_18c[uVar39 + 2] = 0;
                    local_1a8[uVar39 + 1] = (uint)local_230;
                    uVar27 = local_210 & 0xffffffff;
                  }
                  uVar36 = local_1a8[uVar39];
                  uVar14 = puVar33[(long)(int)uVar36 + -1];
                  if (uVar14 == 0) {
                    uVar14 = computeCellSize((CellArray *)local_1e8,uVar36 - 1);
                    puVar33 = local_250;
                  }
                  iVar26 = uVar14 + 2;
                  if ((int)local_220 == 0) {
                    iVar26 = 0;
                    if ((int)uVar36 < (int)(uint)local_230) {
                      uVar13 = puVar33[(int)uVar36];
                      if (uVar13 == 0) {
                        uVar13 = computeCellSize((CellArray *)local_1e8,uVar36);
                        puVar33 = local_250;
                      }
                      iVar26 = uVar13 + 2;
                    }
                  }
                  local_18c[uVar39 + 2] = local_18c[uVar39 + 2] + iVar26;
                  uVar31 = uVar31 - (uVar14 + 2);
                  local_1a8[uVar39] = uVar36 - 1;
                  uVar24 = local_238;
                } while ((int)(Pgno)local_248 < (int)uVar31);
              }
              pCur = local_240;
              local_18c[uVar39 + 1] = uVar31;
              uVar31 = local_1a8[uVar39];
              if ((int)uVar31 < (int)(uint)local_230) {
                bVar44 = true;
                local_210 = uVar27;
                lVar37 = (long)(int)uVar31;
                do {
                  lVar22 = lVar37 + 1;
                  uVar14 = puVar33[lVar37];
                  if (uVar14 == 0) {
                    uVar14 = computeCellSize((CellArray *)local_1e8,uVar31);
                    puVar33 = local_250;
                    uVar27 = local_210;
                  }
                  iVar26 = uVar14 + 2;
                  if ((int)(Pgno)local_248 < (int)(local_18c[uVar39 + 1] + iVar26)) {
                    if (bVar44) {
                      if (uVar39 == 0) {
                        iVar26 = 0;
                      }
                      else {
                        iVar26 = *(int *)((long)&local_1b0 + uVar39 * 4 + 4);
                      }
                      bVar44 = true;
                      uVar24 = local_238;
                      if ((int)uVar31 <= iVar26) {
                        bVar44 = false;
                        local_170 = (u16 *)CONCAT44(local_170._4_4_,0xb);
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x105c0,
                                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34"
                                   );
                        uVar24 = local_238;
                        puVar33 = local_250;
                        uVar27 = local_210;
                      }
                      goto LAB_0014238c;
                    }
                    break;
                  }
                  local_18c[uVar39 + 1] = local_18c[uVar39 + 1] + iVar26;
                  local_1a8[uVar39] = uVar31 + 1;
                  if (((int)local_220 == 0) && (iVar26 = 0, lVar22 < (long)local_208)) {
                    uVar14 = puVar33[lVar22];
                    if (uVar14 == 0) {
                      uVar14 = computeCellSize((CellArray *)local_1e8,uVar31 + 1);
                      puVar33 = local_250;
                      uVar27 = local_210;
                    }
                    iVar26 = uVar14 + 2;
                  }
                  local_18c[uVar39 + 2] = local_18c[uVar39 + 2] - iVar26;
                  bVar44 = lVar22 < (long)local_208;
                  uVar31 = uVar31 + 1;
                  lVar37 = lVar22;
                } while (local_1b0 + lVar22 != 0);
              }
              bVar44 = true;
              uVar24 = local_238;
              uVar27 = (ulong)((int)uVar39 + 1);
LAB_0014238c:
              if (!bVar44) {
                local_264 = (Pgno)local_170;
                pMVar28 = local_258;
                PVar17 = local_264;
                pMVar30 = local_260;
                goto LAB_00141a3d;
              }
              uVar39 = uVar39 + 1;
            } while ((long)uVar39 < (long)(int)uVar27);
            local_264 = (Pgno)local_170;
            local_1b0 = (ulong)((int)uVar27 - 1);
            local_228 = (MemPage *)
                        ((long)local_228 + (local_a8 * 8 - (ulong)(uint)((int)local_220 * 2)));
            uVar39 = local_1b0;
            local_210 = uVar27;
            do {
              if ((int)uVar39 < 1) {
                local_250 = (u16 *)CONCAT44(local_250._4_4_,(uint)*local_148->aData);
                pCur = local_240;
                uVar39 = local_1f8;
                if ((int)uVar27 < 1) {
                  pMVar30 = (MemPage *)0x0;
                  goto LAB_0014286a;
                }
                uVar40 = 0;
                pMVar30 = (MemPage *)0x0;
                goto LAB_001426bc;
              }
              uVar31 = local_18c[uVar39];
              uVar36 = local_18c[uVar39 + 1];
              uVar29 = *(uint *)((long)&local_1b0 + uVar39 * 4 + 4);
              lVar37 = (long)(int)uVar29 - ((ulong)local_220 & 0xffffffff);
              if (puVar33[lVar37] == 0) {
                computeCellSize((CellArray *)local_1e8,(int)lVar37);
                puVar33 = local_250;
                uVar27 = local_210;
              }
              bVar44 = uVar39 == local_1b0;
              lVar37 = (long)(int)uVar29 + 1;
              local_208 = uVar39;
              do {
                uVar29 = uVar29 - 1;
                if (puVar33[lVar37 + -2] == 0) {
                  computeCellSize((CellArray *)local_1e8,uVar29);
                  puVar33 = local_250;
                  uVar27 = local_210;
                }
                uVar24 = local_238;
                if ((uVar36 != 0) &&
                   (((char)local_108 != '\0' ||
                    ((int)((uVar31 + (uint)bVar44 * 2 + -2) - (uint)puVar33[lVar37 + -2]) <
                     (int)(local_228->aiOvfl[lVar37 + -0xe] + uVar36 + 2))))) break;
                uVar36 = uVar36 + local_228->aiOvfl[lVar37 + -0xe] + 2;
                uVar31 = (uVar31 - puVar33[lVar37 + -2]) - 2;
                local_1a8[uVar39 - 1] = uVar29;
                lVar37 = lVar37 + -1;
              } while (1 < lVar37);
              local_18c[local_208 + 1] = uVar36;
              local_18c[uVar39] = uVar31;
              lVar37 = uVar39 - 1;
              uVar31 = 0;
              if (local_208 != 1) {
                uVar31 = local_1a8[(int)local_208 - 2];
              }
              uVar39 = uVar39 - 1;
            } while ((int)uVar31 < (int)local_1a8[lVar37]);
            local_260 = (MemPage *)0x0;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
            local_264 = 0xb;
            pMVar28 = local_258;
            pCur = local_240;
            PVar17 = local_264;
            pMVar30 = local_260;
          }
        }
        else {
LAB_00141a0d:
          pCur = local_240;
          local_214 = (Pgno)local_248;
          local_260 = (MemPage *)0x0;
          memset(&local_1c8,0,(long)(int)uVar36 * 8 + 8);
          uVar24 = local_238;
          PVar17 = local_264;
          pMVar30 = local_260;
        }
        goto LAB_00141a3d;
      }
      PVar15 = 7;
      goto LAB_00141a9d;
    }
    goto LAB_00141abf;
  }
  PVar15 = 0;
  if (pMVar28->nOverflow == '\0') {
    bVar44 = false;
  }
  else {
    local_138[0] = (MemPage *)0x0;
    local_1c8._0_4_ = 0;
    pBVar7 = pMVar28->pBt;
    iVar26 = sqlite3PagerWrite(pMVar28->pDbPage);
    local_1e8._0_4_ = iVar26;
    if (iVar26 == 0) {
      iVar26 = allocateBtreePage(pBVar7,local_138,(Pgno *)&local_1c8,pMVar28->pgno,'\0');
      local_1e8._0_4_ = iVar26;
      copyNodeContent(pMVar28,local_138[0],(int *)local_1e8);
      if (pBVar7->autoVacuum != '\0') {
        ptrmapPut(pBVar7,(Pgno)local_1c8,'\x05',pMVar28->pgno,(int *)local_1e8);
      }
    }
    pMVar30 = local_138[0];
    PVar15 = local_1e8._0_4_;
    if (local_1e8._0_4_ == 0) {
      memcpy(local_138[0]->aiOvfl,pMVar28->aiOvfl,(ulong)((uint)pMVar28->nOverflow * 2));
      memcpy(pMVar30->apOvfl,pMVar28->apOvfl,(ulong)pMVar28->nOverflow << 3);
      pMVar30->nOverflow = pMVar28->nOverflow;
      zeroPage(pMVar28,*pMVar30->aData & 0xfffffff7);
      *(Pgno *)(pMVar28->aData + (ulong)pMVar28->hdrOffset + 8) =
           (Pgno)local_1c8 >> 0x18 | ((Pgno)local_1c8 & 0xff0000) >> 8 |
           ((Pgno)local_1c8 & 0xff00) << 8 | (Pgno)local_1c8 << 0x18;
      pCur->apPage[1] = pMVar30;
      PVar15 = 0;
    }
    else {
      pCur->apPage[1] = (MemPage *)0x0;
      if (local_138[0] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_138[0]->pDbPage);
      }
    }
    bVar44 = true;
    if (PVar15 == 0) {
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      PVar15 = 0;
    }
  }
  goto LAB_00141ada;
  while (uVar40 = uVar40 + 1, (uVar27 & 0xffffffff) != uVar40) {
LAB_001426bc:
    pBVar7 = local_200;
    if (uVar39 < uVar40) {
      PVar15 = 1;
      if ((char)local_108 == '\0') {
        PVar15 = local_214;
      }
      bVar44 = false;
      local_264 = allocateBtreePage(local_200,(MemPage **)&local_100,&local_214,PVar15,'\0');
      iVar11 = local_100.nKey;
      uVar39 = local_1f8;
      if (local_264 == 0) {
        zeroPage((MemPage *)local_100.nKey,(int)local_250);
        local_138[uVar40] = (MemPage *)iVar11;
        pMVar30 = (MemPage *)(ulong)((int)pMVar30 + 1);
        auStack_c8[uVar40] = (uint)local_230;
        uVar39 = local_1f8;
        pCur = local_240;
        if ((pBVar7->autoVacuum == '\0') ||
           (ptrmapPut(pBVar7,*(Pgno *)(iVar11 + 4),'\x05',local_1f0->pgno,(int *)&local_264),
           uVar39 = local_1f8, pCur = local_240, local_264 == 0)) goto LAB_001427cd;
        bVar44 = false;
      }
    }
    else {
      pMVar28 = (MemPage *)(&local_1c8)[uVar40];
      local_138[uVar40] = pMVar28;
      local_100.nKey = (i64)pMVar28;
      (&local_1c8)[uVar40] = 0;
      local_264 = sqlite3PagerWrite(pMVar28->pDbPage);
      pMVar30 = (MemPage *)(ulong)((int)pMVar30 + 1);
      if (local_264 == 0) {
LAB_001427cd:
        bVar44 = true;
      }
      else {
        bVar44 = false;
      }
    }
    uVar24 = local_238;
    pMVar28 = local_258;
    PVar17 = local_264;
    if (!bVar44) goto LAB_00141a3d;
  }
LAB_0014286a:
  local_260 = pMVar30;
  if (0 < (int)pMVar30) {
    lVar37 = 0;
    do {
      pMVar28 = local_138[lVar37];
      PVar15 = pMVar28->pgno;
      aPStack_78[lVar37] = PVar15;
      (&PStack_e8)[lVar37] = PVar15;
      auStack_82[lVar37] = pMVar28->pDbPage->flags;
      if (lVar37 != 0) {
        lVar22 = 0;
        do {
          if (aPStack_78[lVar22] == PVar15) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
            local_264 = 0xb;
            pMVar28 = local_258;
            PVar17 = local_264;
            pMVar30 = local_260;
            goto LAB_00141a3d;
          }
          lVar22 = lVar22 + 1;
        } while (lVar37 != lVar22);
      }
      lVar37 = lVar37 + 1;
    } while ((MemPage *)lVar37 != pMVar30);
  }
  pMVar43 = pMVar30;
  PVar15 = local_214;
  if (0 < (int)pMVar30) {
    uVar24 = 0;
    do {
      uVar27 = 0;
      if ((int)local_260 != 1) {
        uVar19 = 1;
        uVar40 = 0;
        do {
          uVar27 = uVar19 & 0xffffffff;
          if ((&PStack_e8)[(int)uVar40] <= (&PStack_e8)[uVar19]) {
            uVar27 = uVar40;
          }
          uVar19 = uVar19 + 1;
          uVar40 = uVar27;
        } while (pMVar30 != (MemPage *)uVar19);
      }
      pMVar43 = (MemPage *)(long)(int)uVar27;
      PVar15 = (&PStack_e8)[(long)pMVar43];
      (&PStack_e8)[(long)pMVar43] = 0xffffffff;
      if (uVar24 != uVar27) {
        if ((long)uVar24 < (long)pMVar43) {
          pPVar8 = local_138[(long)pMVar43]->pDbPage;
          uVar6 = local_200->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,(int)uVar27 + uVar6 + 1);
        }
        pMVar28 = local_138[uVar24];
        pPVar8 = pMVar28->pDbPage;
        pPVar8->flags = auStack_82[(long)pMVar43];
        sqlite3PcacheMove(pPVar8,PVar15);
        pMVar28->pgno = PVar15;
      }
      uVar24 = uVar24 + 1;
    } while ((MemPage *)uVar24 != pMVar30);
  }
  uVar36 = (uint)local_260;
  local_208 = (ulong)(int)uVar36;
  pvVar2 = (&local_140)[local_208];
  uVar31 = *(uint *)((long)pvVar2 + 4);
  *local_98 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 | uVar31 << 0x18;
  if ((((ulong)local_250 & 8) == 0) && (local_14c != uVar36)) {
    ppMVar20 = (MemPage **)&local_1c8;
    if ((int)local_14c < (int)uVar36) {
      ppMVar20 = local_138;
    }
    *(undefined4 *)(*(long *)((long)pvVar2 + 0x50) + 8) =
         *(undefined4 *)(ppMVar20[uVar39]->aData + 8);
  }
  uVar31 = (uint)local_160;
  local_214 = PVar15;
  if (local_200->autoVacuum == '\0') {
LAB_00142d64:
    uVar10 = local_1e8._16_8_;
    if (1 < (int)local_260) {
      local_250 = (u16 *)local_1e8._24_8_;
      local_228 = (MemPage *)(ulong)((int)local_260 - 1);
      uVar27 = (ulong)uVar31;
      pMVar43 = (MemPage *)0x0;
      iVar26 = 0;
      local_230 = uVar27;
      do {
        pMVar28 = local_138[(long)pMVar43];
        lVar37 = (long)(int)local_1a8[(long)pMVar43];
        puVar34 = *(u8 **)((u16 *)(uVar10 + 0x1a) + lVar37 * 4 + -0xd);
        uVar31 = (uint)local_250[lVar37] + (int)local_b0;
        puVar38 = (u8 *)((long)iVar26 + (long)local_158);
        if (pMVar28->leaf == '\0') {
          *(undefined4 *)(pMVar28->aData + 8) = *(undefined4 *)puVar34;
        }
        else if ((int)local_220 == 0) {
          puVar34 = puVar34 + -4;
          if (local_250[lVar37] == 4) {
            uVar14 = (*local_1f0->xCellSize)(local_1f0,puVar34);
            uVar31 = (uint)uVar14;
            uVar27 = local_230;
          }
        }
        else {
          (*pMVar28->xParseCell)
                    (pMVar28,*(u8 **)((u16 *)(uVar10 + 0x1a) + lVar37 * 4 + -0x11),&local_100);
          iVar35 = sqlite3PutVarint(puVar38 + 4,local_100.nKey);
          uVar31 = iVar35 + 4;
          puVar34 = puVar38;
          puVar38 = (u8 *)0x0;
        }
        insertCell(local_1f0,(int)pMVar43 + (int)uVar27,puVar34,uVar31,puVar38,pMVar28->pgno,
                   (int *)&local_264);
        uVar24 = local_238;
        pMVar28 = local_258;
        pCur = local_240;
        PVar17 = local_264;
        pMVar30 = local_260;
        if (local_264 != 0) goto LAB_00141a3d;
        iVar26 = iVar26 + uVar31;
        pMVar43 = (MemPage *)((long)pMVar43 + 1);
      } while (local_228 != pMVar43);
    }
    iVar26 = (int)local_260;
    uVar31 = 1 - iVar26;
    PVar17 = local_264;
    if ((int)uVar31 < iVar26) {
      bVar44 = (int)local_220 == 0;
      uVar9 = local_1e8._0_4_;
      local_220 = (undefined1 *)CONCAT44(local_220._4_4_,local_1a8[0]);
      iVar26 = iVar26 * 2 + -1;
      do {
        uVar36 = -uVar31;
        if (0 < (int)uVar31) {
          uVar36 = uVar31;
        }
        uVar24 = (ulong)uVar36;
        iVar16 = 0x3b;
        if ((*(char *)((long)&local_168 + uVar24) == '\0') &&
           ((-1 < (int)uVar31 ||
            (iVar16 = 0,
            *(int *)((long)&local_1b0 + (long)(int)uVar36 * 4 + 4) <=
            (int)auStack_c8[(long)(int)uVar36 + -1])))) {
          if (uVar31 == 0) {
            iVar21 = 0;
            iVar35 = 0;
            iVar16 = (int)local_220;
          }
          else {
            iVar35 = uVar9;
            if (uVar36 <= (uint)local_110) {
              iVar35 = auStack_c8[(long)(int)uVar36 + -1] + (uint)bVar44;
            }
            iVar21 = *(int *)((long)&local_1b0 + (long)(int)uVar36 * 4 + 4) + (uint)bVar44;
            iVar16 = local_1a8[uVar24] - iVar21;
          }
          pMVar43 = local_138[uVar24];
          PVar17 = editPage(pMVar43,iVar35,iVar21,iVar16,(CellArray *)local_1e8);
          iVar16 = 4;
          if (PVar17 == 0) {
            *(undefined1 *)((long)&local_168 + uVar24) = 1;
            pMVar43->nFree = (short)local_248 - (short)local_18c[uVar24 + 1];
            iVar16 = 0;
          }
        }
        PVar15 = (Pgno)pMVar43;
        if ((iVar16 != 0) && (pMVar28 = local_258, pCur = local_240, iVar16 != 0x3b))
        goto joined_r0x00143096;
        uVar31 = uVar31 + 1;
        iVar26 = iVar26 + -1;
      } while (iVar26 != 0);
    }
    pMVar43 = local_138[0];
    pMVar30 = local_1f0;
    pBVar7 = local_200;
    uVar24 = local_238;
    pCur = local_240;
    pMVar28 = local_258;
    local_264 = PVar17;
    if ((((char)local_a0 == '\x01') && (local_1f0->nCell == 0)) &&
       ((ushort)local_1f0->hdrOffset <= local_138[0]->nFree)) {
      local_264 = defragmentPage(local_138[0],-1);
      copyNodeContent(pMVar43,pMVar30,(int *)&local_264);
      uVar24 = local_238;
      pCur = local_240;
      pMVar28 = local_258;
      if (local_264 == 0) {
        local_264 = freePage2(pMVar43->pBt,pMVar43,pMVar43->pgno);
      }
    }
    else if (((0 < (int)local_260) && (local_200->autoVacuum != '\0')) && ((char)local_150 == '\0'))
    {
      local_248 = (ulong)local_260 & 0xffffffff;
      uVar27 = 0;
      do {
        uVar31 = *(uint *)(local_138[uVar27]->aData + 8);
        ptrmapPut(pBVar7,uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                         uVar31 << 0x18,'\x05',local_138[uVar27]->pgno,(int *)&local_264);
        uVar27 = uVar27 + 1;
      } while (local_248 != uVar27);
    }
    uVar27 = local_208;
    iVar26 = (int)local_260;
    iVar35 = (int)local_110;
    PVar17 = local_264;
    pMVar30 = local_260;
    if (iVar26 <= iVar35) {
      lVar37 = 0;
      do {
        if (PVar17 == 0) {
          pMVar30 = (MemPage *)(&local_1c8)[uVar27 + lVar37];
          PVar17 = freePage2(pMVar30->pBt,pMVar30,pMVar30->pgno);
        }
        lVar37 = lVar37 + 1;
        pMVar30 = local_260;
      } while ((iVar35 - iVar26) + 1 != (int)lVar37);
    }
  }
  else {
    if (0 < (int)(uint)local_230) {
      local_250 = (u16 *)CONCAT44(local_250._4_4_,(uint)((int)local_220 == 0));
      local_230 = (ulong)(int)local_200->usableSize;
      uVar36 = (uint)local_138[0]->nCell + (uint)local_138[0]->nOverflow;
      puVar41 = (uint *)local_138[0]->aData;
      uVar27 = 0;
      pMVar43 = (MemPage *)0x0;
      iVar26 = 0;
      pMVar28 = local_138[0];
      uVar24 = local_160;
      do {
        if (uVar27 == uVar36) {
          uVar31 = (int)pMVar43 + 1;
          ppMVar20 = (MemPage **)&local_1c8;
          if ((int)uVar31 < (int)local_260) {
            ppMVar20 = local_138;
          }
          pMVar30 = ppMVar20[(long)(int)pMVar43 + 1];
          uVar36 = uVar36 + (int)local_250 + (uint)pMVar30->nCell + (uint)pMVar30->nOverflow;
          puVar41 = (uint *)pMVar30->aData;
          pMVar43 = (MemPage *)(ulong)uVar31;
        }
        pCell = *(uint **)((u16 *)(local_1e8._16_8_ + 0x1a) + uVar27 * 4 + -0xd);
        iVar35 = iVar26;
        if (uVar27 == local_1a8[iVar26]) {
          iVar35 = iVar26 + 1;
          pMVar28 = local_138[(long)iVar26 + 1];
          if ((int)local_220 != 0) goto LAB_00142c38;
          iVar16 = 0x35;
          iVar26 = iVar35;
        }
        else {
LAB_00142c38:
          if (((((int)local_260 <= (int)pMVar43) || (pMVar28->pgno != aPStack_78[(int)pMVar43])) ||
              (pCell < puVar41)) ||
             (iVar16 = 0, iVar26 = iVar35, (uint *)((long)puVar41 + local_230) <= pCell)) {
            if ((char)local_150 == '\0') {
              local_228 = (MemPage *)CONCAT44(local_228._4_4_,iVar35);
              uVar31 = *pCell;
              ptrmapPut(local_200,
                        uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                        uVar31 << 0x18,'\x05',pMVar28->pgno,(int *)&local_264);
              uVar24 = local_160;
              iVar35 = (int)local_228;
            }
            uVar14 = *(u16 *)(local_1e8._24_8_ + uVar27 * 2);
            if (uVar14 == 0) {
              local_228 = pMVar43;
              uVar14 = computeCellSize((CellArray *)local_1e8,(int)uVar27);
              uVar24 = local_160;
              pMVar43 = local_228;
            }
            if (pMVar28->minLocal < uVar14) {
              ptrmapPutOvflPtr(pMVar28,(u8 *)pCell,(int *)&local_264);
              uVar24 = local_160;
            }
            iVar16 = (uint)(local_264 != 0) << 2;
            iVar26 = iVar35;
          }
        }
        uVar31 = (uint)uVar24;
        if ((iVar16 != 0x35) && (iVar16 != 0)) goto LAB_00142d3e;
        uVar27 = uVar27 + 1;
      } while ((long)uVar27 < (long)(int)local_1e8._0_4_);
    }
    iVar16 = 0;
LAB_00142d3e:
    PVar15 = (Pgno)pMVar43;
    PVar17 = local_264;
    pMVar28 = local_258;
    pCur = local_240;
    if (iVar16 == 0) goto LAB_00142d64;
joined_r0x00143096:
    local_264 = PVar17;
    uVar24 = local_238;
    PVar17 = local_264;
    pMVar30 = local_260;
    local_258 = pMVar28;
    local_240 = pCur;
    if (iVar16 != 4) goto LAB_00141a9d;
  }
LAB_00141a3d:
  local_260 = pMVar30;
  local_264 = PVar17;
  sqlite3ScratchFree((void *)local_1e8._16_8_);
  pMVar30 = local_260;
  uVar27 = 0;
  do {
    if ((&local_1c8)[uVar27] != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)((&local_1c8)[uVar27] + 0x70));
    }
    uVar27 = uVar27 + 1;
  } while (uVar24 != uVar27);
  PVar15 = local_264;
  if (0 < (int)pMVar30) {
    uVar24 = 0;
    do {
      if (local_138[uVar24] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_138[uVar24]->pDbPage);
      }
      uVar24 = uVar24 + 1;
      PVar15 = local_264;
    } while (((ulong)pMVar30 & 0xffffffff) != uVar24);
  }
LAB_00141a9d:
  if (local_140 != (void *)0x0) {
    pcache1Free(local_140);
  }
  local_140 = local_158;
LAB_00141abf:
  pMVar28->nOverflow = '\0';
  if (pMVar28 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar28->pDbPage);
  }
  pCur->iPage = pCur->iPage + -1;
  bVar44 = true;
LAB_00141ada:
  if ((!bVar44) || (PVar15 != 0)) {
    if (local_140 != (void *)0x0) {
      pcache1Free(local_140);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return PVar15;
  }
  goto LAB_00141688;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->apPage[iPage];

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          assert( pCur->apPage[1]->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}